

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.hpp
# Opt level: O3

void __thiscall tcu::ResourcePrefix::~ResourcePrefix(ResourcePrefix *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Archive)._vptr_Archive = (_func_int **)&PTR__ResourcePrefix_002743e8;
  pcVar2 = (this->m_prefix)._M_dataplus._M_p;
  paVar1 = &(this->m_prefix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual						~ResourcePrefix		(void) {}